

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetInstanceTypeHandler
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,bool hasChanged)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  JavascriptArray *pJVar6;
  INT_PTR *pIVar7;
  
  bVar3 = JavascriptArray::IsNonES5Array(instance);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                ,0x10e,"(JavascriptArray::IsNonES5Array(instance))",
                                "JavascriptArray::IsNonES5Array(instance)");
    if (!bVar3) goto LAB_00db7d8b;
    *puVar5 = 0;
  }
  if (((this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler.flags & 0x20) == 0) {
    if (instance != (DynamicObject *)0x0) goto LAB_00db7ab3;
  }
  else {
    ScriptContextOptimizationOverrideInfo::DisableArraySetElementFastPath
              (&((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr)->optimizationOverrides);
LAB_00db7ab3:
    bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
    if ((bVar3) &&
       (this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(instance),
       this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
    }
  }
  pJVar6 = VarTo<Js::JavascriptArray,Js::DynamicObject>(instance);
  pJVar6 = JavascriptArray::EnsureNonNativeArray(pJVar6);
  BVar4 = CrossSite::IsCrossSiteObjectTyped<Js::JavascriptArray>(pJVar6);
  pp_Var1 = (pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  if (BVar4 == 0) {
    if (pp_Var1 == (_func_int **)VirtualTableInfo<Js::JavascriptArray>::Address) {
      pIVar7 = &VirtualTableInfo<Js::ES5Array>::Address;
      goto LAB_00db7bf4;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                ,0x127,
                                "(VirtualTableInfo<JavascriptArray>::HasVirtualTable(arrayInstance))"
                                ,"VirtualTableInfo<JavascriptArray>::HasVirtualTable(arrayInstance)"
                               );
    if (!bVar3) goto LAB_00db7d8b;
    pIVar7 = &VirtualTableInfo<Js::ES5Array>::Address;
  }
  else {
    if (pp_Var1 ==
        (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptArray>_>::Address) {
      pIVar7 = &VirtualTableInfo<Js::CrossSiteObject<Js::ES5Array>_>::Address;
      goto LAB_00db7bf4;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                ,0x12d,
                                "(VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(arrayInstance))"
                                ,
                                "VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(arrayInstance)"
                               );
    if (!bVar3) {
LAB_00db7d8b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pIVar7 = &VirtualTableInfo<Js::CrossSiteObject<Js::ES5Array>_>::Address;
  }
  *puVar5 = 0;
LAB_00db7bf4:
  (pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)*pIVar7;
  DynamicObject::ChangeType((DynamicObject *)pJVar6);
  DynamicTypeHandler::SetInstanceTypeHandler
            ((DynamicTypeHandler *)this,(DynamicObject *)pJVar6,false);
  return;
}

Assistant:

void ES5ArrayTypeHandlerBase<T>::SetInstanceTypeHandler(DynamicObject* instance, bool hasChanged)
    {
        Assert(JavascriptArray::IsNonES5Array(instance));
        if (this->GetFlags() & DynamicTypeHandler::IsPrototypeFlag)
        {
            // We have ES5 array has array/object prototype, we can't use array fast path for set
            // as index could be readonly or be getter/setter in the prototype
            // TODO: we may be able to separate out the array fast path and the object array fast path
            // here.
            instance->GetScriptContext()->optimizationOverrides.DisableArraySetElementFastPath();
        }

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        JavascriptArray * arrayInstance = JavascriptArray::EnsureNonNativeArray(VarTo<JavascriptArray>(instance));
#if DBG
        bool doneConversion = false;
        Js::Type* oldType = arrayInstance->GetType();
#endif
        bool isCrossSiteObject = false;

        try
        {
            if (!CrossSite::IsCrossSiteObjectTyped(arrayInstance))
            {
                // Convert instance to an ES5Array
                Assert(VirtualTableInfo<JavascriptArray>::HasVirtualTable(arrayInstance));
                VirtualTableInfo<ES5Array>::SetVirtualTable(arrayInstance);
            }
            else
            {
                // If instance was a cross-site JavascriptArray, convert to a cross-site ES5Array
                Assert(VirtualTableInfo<CrossSiteObject<JavascriptArray>>::HasVirtualTable(arrayInstance));
                VirtualTableInfo<CrossSiteObject<ES5Array>>::SetVirtualTable(arrayInstance);
                isCrossSiteObject = true;
            }

            arrayInstance->ChangeType(); // force change TypeId
            __super::SetInstanceTypeHandler(arrayInstance, false); // after forcing the type change, we don't need to changeType again.
#if DBG
            doneConversion = true;
#endif
        }
        catch(Js::ExceptionBase)
        {
            Assert(!doneConversion);
            // change vtbl shouldn't OOM. revert back the vtable.
            if (isCrossSiteObject)
            {
                Assert(VirtualTableInfo<CrossSiteObject<ES5Array>>::HasVirtualTable(arrayInstance));
                VirtualTableInfo<CrossSiteObject<JavascriptArray>>::SetVirtualTable(arrayInstance);
            }
            else
            {
                Assert(VirtualTableInfo<ES5Array>::HasVirtualTable(arrayInstance));
                VirtualTableInfo<JavascriptArray>::SetVirtualTable(arrayInstance);
            }
            // The only allocation is in ChangeType, which won't have changed the type yet.
            Assert(arrayInstance->GetType() == oldType);
            throw;
        }
    }